

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGhsMultiGenerator::WriteTargets(cmGlobalGhsMultiGenerator *this,cmLocalGenerator *root)

{
  pointer pcVar1;
  pointer ppcVar2;
  cmGeneratorTarget *this_00;
  pointer ppcVar3;
  bool bVar4;
  TargetType TVar5;
  int iVar6;
  string *psVar7;
  long *plVar8;
  long *plVar9;
  size_type *psVar10;
  cmGlobalGhsMultiGenerator *pcVar11;
  cmGeneratorTarget **tgt;
  pointer ppcVar12;
  pointer ppcVar13;
  string name;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> build;
  string message;
  string fname;
  string rootBinaryDir;
  cmGeneratedFileStream fbld;
  long *local_338;
  long local_328;
  long lStack_320;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> local_318;
  cmGlobalGhsMultiGenerator *local_300;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  _func_int **local_278;
  _Alloc_hider local_268;
  
  psVar7 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(root);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  pcVar1 = (psVar7->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b8,pcVar1,pcVar1 + psVar7->_M_string_length);
  std::__cxx11::string::append((char *)&local_2b8);
  ppcVar13 = (this->ProjectTargets).
             super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppcVar2 = (this->ProjectTargets).
            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_300 = this;
  if (ppcVar13 != ppcVar2) {
    do {
      this_00 = *ppcVar13;
      TVar5 = cmGeneratorTarget::GetType(this_00);
      if (((TVar5 != INTERFACE_LIBRARY) &&
          (TVar5 = cmGeneratorTarget::GetType(this_00), TVar5 != MODULE_LIBRARY)) &&
         (TVar5 = cmGeneratorTarget::GetType(this_00), TVar5 != SHARED_LIBRARY)) {
        TVar5 = cmGeneratorTarget::GetType(this_00);
        if (TVar5 == GLOBAL_TARGET) {
          psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
          (*(local_300->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x18])();
          iVar6 = std::__cxx11::string::compare((char *)psVar7);
          if (iVar6 != 0) goto LAB_0021f3bc;
        }
        psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
        local_278 = (_func_int **)&stack0xfffffffffffffd98;
        pcVar1 = (psVar7->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&stack0xfffffffffffffd88,pcVar1,pcVar1 + psVar7->_M_string_length);
        std::__cxx11::string::append((char *)&stack0xfffffffffffffd88);
        plVar8 = (long *)std::__cxx11::string::append((char *)&stack0xfffffffffffffd88);
        local_338 = &local_328;
        plVar9 = plVar8 + 2;
        if ((long *)*plVar8 == plVar9) {
          local_328 = *plVar9;
          lStack_320 = plVar8[3];
        }
        else {
          local_328 = *plVar9;
          local_338 = (long *)*plVar8;
        }
        *plVar8 = (long)plVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((_Alloc_hider *)local_278 != &stack0xfffffffffffffd98) {
          operator_delete(local_278,(ulong)(local_268._M_p + 1));
        }
        local_278 = (_func_int **)&stack0xfffffffffffffd98;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&stack0xfffffffffffffd88,local_2b8._M_dataplus._M_p,
                   local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
        std::__cxx11::string::append((char *)&stack0xfffffffffffffd88);
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&stack0xfffffffffffffd88,(ulong)local_338);
        local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
        psVar10 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_2d8.field_2._M_allocated_capacity = *psVar10;
          local_2d8.field_2._8_8_ = plVar8[3];
        }
        else {
          local_2d8.field_2._M_allocated_capacity = *psVar10;
          local_2d8._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_2d8._M_string_length = plVar8[1];
        *plVar8 = (long)psVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((_Alloc_hider *)local_278 != &stack0xfffffffffffffd98) {
          operator_delete(local_278,(ulong)(local_268._M_p + 1));
        }
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)&stack0xfffffffffffffd88,&local_2d8,false,None);
        pcVar11 = (cmGlobalGhsMultiGenerator *)&stack0xfffffffffffffd88;
        cmGeneratedFileStream::SetCopyIfDifferent
                  ((cmGeneratedFileStream *)&stack0xfffffffffffffd88,true);
        WriteFileHeader(pcVar11,(ostream *)&stack0xfffffffffffffd88);
        GhsMultiGpj::WriteGpjTag(PROJECT,(ostream *)&stack0xfffffffffffffd88);
        local_318.
        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_318.
        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_318.
        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pcVar11 = local_300;
        bVar4 = ComputeTargetBuildOrder(local_300,this_00,&local_318);
        ppcVar3 = local_318.
                  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ppcVar12 = local_318.
                   super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if (bVar4) {
          psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
          std::operator+(&local_298,"The inter-target dependency graph for target [",psVar7);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_298);
          local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
          psVar10 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_2f8.field_2._M_allocated_capacity = *psVar10;
            local_2f8.field_2._8_8_ = plVar8[3];
          }
          else {
            local_2f8.field_2._M_allocated_capacity = *psVar10;
            local_2f8._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_2f8._M_string_length = plVar8[1];
          *plVar8 = (long)psVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          }
          cmSystemTools::Error(&local_2f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
            operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          for (; ppcVar12 != ppcVar3; ppcVar12 = ppcVar12 + 1) {
            WriteProjectLine(pcVar11,(ostream *)&stack0xfffffffffffffd88,*ppcVar12,root,&local_2b8);
          }
        }
        cmGeneratedFileStream::Close((cmGeneratedFileStream *)&stack0xfffffffffffffd88);
        if (local_318.
            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_318.
                          super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_318.
                                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_318.
                                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        cmGeneratedFileStream::~cmGeneratedFileStream
                  ((cmGeneratedFileStream *)&stack0xfffffffffffffd88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
        }
        if (local_338 != &local_328) {
          operator_delete(local_338,local_328 + 1);
        }
      }
LAB_0021f3bc:
      ppcVar13 = ppcVar13 + 1;
    } while (ppcVar13 != ppcVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteTargets(cmLocalGenerator* root)
{
  std::string rootBinaryDir = root->GetCurrentBinaryDirectory();
  rootBinaryDir += "/CMakeFiles";

  // All known targets
  for (cmGeneratorTarget const* target : this->ProjectTargets) {
    if (target->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        (target->GetType() == cmStateEnums::GLOBAL_TARGET &&
         target->GetName() != GetInstallTargetName())) {
      continue;
    }

    // create target build file
    std::string name = target->GetName() + ".tgt" + FILE_EXTENSION;
    std::string fname = rootBinaryDir + "/" + name;
    cmGeneratedFileStream fbld(fname);
    fbld.SetCopyIfDifferent(true);
    this->WriteFileHeader(fbld);
    GhsMultiGpj::WriteGpjTag(GhsMultiGpj::PROJECT, fbld);
    std::vector<cmGeneratorTarget const*> build;
    if (ComputeTargetBuildOrder(target, build)) {
      std::string message = "The inter-target dependency graph for target [" +
        target->GetName() + "] had a cycle.\n";
      cmSystemTools::Error(message);
    } else {
      for (auto& tgt : build) {
        WriteProjectLine(fbld, tgt, root, rootBinaryDir);
      }
    }
    fbld.Close();
  }
}